

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest.h
# Opt level: O3

void __thiscall
testing::TestProperty::TestProperty(TestProperty *this,string *a_key,string *a_value)

{
  pointer pcVar1;
  
  (this->key_)._M_dataplus._M_p = (pointer)&(this->key_).field_2;
  pcVar1 = (a_key->_M_dataplus)._M_p;
  std::__cxx11::string::_M_construct<char*>((string *)this,pcVar1,pcVar1 + a_key->_M_string_length);
  (this->value_)._M_dataplus._M_p = (pointer)&(this->value_).field_2;
  pcVar1 = (a_value->_M_dataplus)._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&this->value_,pcVar1,pcVar1 + a_value->_M_string_length);
  return;
}

Assistant:

TestProperty(const std::string& a_key, const std::string& a_value) :
    key_(a_key), value_(a_value) {
  }